

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer_e2e_test.cpp
# Opt level: O2

void peer_udp_broadcast_discovery(void)

{
  uint __line;
  WaitResult<bool> WVar1;
  char *__assertion;
  allocator local_141;
  FindUserDataCallable find_peer2;
  PeerParameters local_118;
  Peer peer2;
  Peer peer1;
  FindUserDataCallable find_peer1;
  allocator local_90 [32];
  FindUserDataCallable local_70;
  FindUserDataCallable local_48;
  
  local_118.min_supported_protocol_version_ = kProtocolVersion1;
  local_118.max_supported_protocol_version_ = kProtocolVersion1;
  local_118.can_use_broadcast_ = true;
  local_118.can_use_multicast_ = false;
  local_118.discovered_peer_ttl_ms_ = 10000;
  local_118.discover_self_ = false;
  local_118.same_peer_mode_ = kSamePeerIpAndPort;
  local_118.can_be_discovered_ = true;
  local_118.can_discover_ = true;
  local_118.port_ = 0x2ef5;
  local_118.multicast_group_address_ = 0;
  local_118.application_id_ = 0x753584;
  local_118.send_timeout_ms_ = 100;
  udpdiscovery::Peer::Peer(&peer1);
  std::__cxx11::string::string((string *)&find_peer2,"peer 1",(allocator *)&find_peer1);
  udpdiscovery::Peer::Start(&peer1,&local_118,(string *)&find_peer2);
  std::__cxx11::string::_M_dispose();
  udpdiscovery::impl::SleepFor(1000);
  udpdiscovery::Peer::Peer(&peer2);
  std::__cxx11::string::string((string *)&find_peer2,"peer 2",(allocator *)&find_peer1);
  udpdiscovery::Peer::Start(&peer2,&local_118,(string *)&find_peer2);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&find_peer1,"peer 2",local_90);
  find_peer2.peer_ = &peer1;
  std::__cxx11::string::string((string *)&find_peer2.user_data_,(string *)&find_peer1);
  std::__cxx11::string::_M_dispose();
  FindUserDataCallable::FindUserDataCallable(&local_48,&find_peer2);
  WVar1 = Wait<bool,FindUserDataCallable>(5000,200,&local_48);
  std::__cxx11::string::_M_dispose();
  if (((uint3)WVar1 & 1) == 0) {
    if (((uint3)WVar1 >> 8 & 1) != 0) {
      std::__cxx11::string::string((string *)local_90,"peer 1",&local_141);
      find_peer1.peer_ = &peer2;
      std::__cxx11::string::string((string *)&find_peer1.user_data_,(string *)local_90);
      std::__cxx11::string::_M_dispose();
      FindUserDataCallable::FindUserDataCallable(&local_70,&find_peer1);
      WVar1 = Wait<bool,FindUserDataCallable>(5000,200,&local_70);
      std::__cxx11::string::_M_dispose();
      if (((uint3)WVar1 & 1) != 0) {
        __assert_fail("find2.is_timeout == false",
                      "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                      ,0x81,"void peer_udp_broadcast_discovery()");
      }
      if (((uint3)WVar1 >> 8 & 1) != 0) {
        udpdiscovery::Peer::StopAndWaitForThreads(&peer1);
        udpdiscovery::Peer::StopAndWaitForThreads(&peer2);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        udpdiscovery::Peer::~Peer(&peer2);
        udpdiscovery::Peer::~Peer(&peer1);
        return;
      }
      __assert_fail("find2.has_result == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                    ,0x82,"void peer_udp_broadcast_discovery()");
    }
    __assertion = "find1.has_result == true";
    __line = 0x7b;
  }
  else {
    __assertion = "find1.is_timeout == false";
    __line = 0x7a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_peer_e2e_test.cpp"
                ,__line,"void peer_udp_broadcast_discovery()");
}

Assistant:

void peer_udp_broadcast_discovery() {
  udpdiscovery::PeerParameters peer_parameters;
  peer_parameters.set_can_discover(true);
  peer_parameters.set_can_be_discovered(true);
  peer_parameters.set_port(kPort);
  peer_parameters.set_application_id(kApplicationId);
  peer_parameters.set_send_timeout_ms(100);

  udpdiscovery::Peer peer1;
  peer1.Start(peer_parameters, "peer 1");

  // TODO: Understand why do we need this timeout.
  udpdiscovery::impl::SleepFor(1000);

  udpdiscovery::Peer peer2;
  peer2.Start(peer_parameters, "peer 2");

  FindUserDataCallable find_peer2(peer1, "peer 2");
  WaitResult<bool> find1 =
      Wait<bool>(/* timeout = */ 5000, /* sleep_timeout = */ 200,
                 /* callable= */ find_peer2);
  assert(find1.is_timeout == false);
  assert(find1.has_result == true);

  FindUserDataCallable find_peer1(peer2, "peer 1");
  WaitResult<bool> find2 =
      Wait<bool>(/* timeout = */ 5000, /* sleep_timeout = */ 200,
                 /* callable= */ find_peer1);
  assert(find2.is_timeout == false);
  assert(find2.has_result == true);

  peer1.StopAndWaitForThreads();
  peer2.StopAndWaitForThreads();
}